

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neighbor-graph.c
# Opt level: O2

void mpr_print_sets(nhdp_domain *domain,neighbor_graph *graph)

{
  if ((log_global_mask[LOG_MPR] & 1) != 0) {
    oonf_log(LOG_SEVERITY_DEBUG,LOG_MPR,"src/nhdp/mpr/neighbor-graph.c",0xfd,(void *)0x0,0,"Set N");
  }
  mpr_print_addr_set(&graph->set_n);
  if ((log_global_mask[LOG_MPR] & 1) != 0) {
    oonf_log(LOG_SEVERITY_DEBUG,LOG_MPR,"src/nhdp/mpr/neighbor-graph.c",0x100,(void *)0x0,0,"Set N1"
            );
  }
  mpr_print_n1_set(domain,&graph->set_n1);
  if ((log_global_mask[LOG_MPR] & 1) != 0) {
    oonf_log(LOG_SEVERITY_DEBUG,LOG_MPR,"src/nhdp/mpr/neighbor-graph.c",0x103,(void *)0x0,0,"Set N2"
            );
  }
  mpr_print_addr_set(&graph->set_n2);
  if ((log_global_mask[LOG_MPR] & 1) != 0) {
    oonf_log(LOG_SEVERITY_DEBUG,LOG_MPR,"src/nhdp/mpr/neighbor-graph.c",0x106,(void *)0x0,0,
             "Set MPR");
  }
  mpr_print_n1_set(domain,&graph->set_mpr);
  return;
}

Assistant:

void
mpr_print_sets(struct nhdp_domain *domain, struct neighbor_graph *graph) {
  OONF_DEBUG(LOG_MPR, "Set N");
  mpr_print_addr_set(&graph->set_n);

  OONF_DEBUG(LOG_MPR, "Set N1");
  mpr_print_n1_set(domain, &graph->set_n1);

  OONF_DEBUG(LOG_MPR, "Set N2");
  mpr_print_addr_set(&graph->set_n2);

  OONF_DEBUG(LOG_MPR, "Set MPR");
  mpr_print_n1_set(domain, &graph->set_mpr);
}